

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O0

int container_shrink_to_fit(container_t *c,uint8_t type)

{
  int iVar1;
  uint8_t in_SIL;
  container_t *in_RDI;
  uint8_t local_11;
  container_t *local_10;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  local_11 = in_SIL;
  local_10 = container_mutable_unwrap_shared(in_RDI,&local_11);
  if (local_11 == '\x01') {
    iVar1 = 0;
  }
  else if (local_11 == '\x02') {
    iVar1 = array_container_shrink_to_fit
                      ((array_container_t *)
                       CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  }
  else {
    iVar1 = run_container_shrink_to_fit
                      ((run_container_t *)
                       CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  }
  return iVar1;
}

Assistant:

static inline int container_shrink_to_fit(container_t *c, uint8_t type) {
    c = container_mutable_unwrap_shared(c, &type);
    switch (type) {
        case BITSET_CONTAINER_TYPE:
            return 0;  // no shrinking possible
        case ARRAY_CONTAINER_TYPE:
            return array_container_shrink_to_fit(CAST_array(c));
        case RUN_CONTAINER_TYPE:
            return run_container_shrink_to_fit(CAST_run(c));
    }
    assert(false);
    roaring_unreachable;
    return 0;  // unreached
}